

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O2

void __thiscall
bgui::PaintBufferFct::PaintBufferFct
          (PaintBufferFct *this,BaseWindowData *_p,ImageAdapterBase *_im,int _x,int _y)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  long lVar4;
  
  (this->super_ParallelFunction)._vptr_ParallelFunction = (_func_int **)&PTR_run_00122c88;
  this->p = _p;
  this->im = _im;
  this->x = _x;
  this->y = _y;
  anon_unknown_0::getShiftFromMask(_p->image->red_mask,&this->rls,&this->rrs);
  anon_unknown_0::getShiftFromMask(this->p->image->green_mask,&this->gls,&this->grs);
  anon_unknown_0::getShiftFromMask(this->p->image->blue_mask,&this->bls,&this->brs);
  lVar4 = (long)this->p->image->width;
  iVar1 = this->x;
  iVar2 = (*this->im->_vptr_ImageAdapterBase[0xb])();
  lVar3 = CONCAT44(extraout_var,iVar2) + (long)iVar1;
  if (lVar4 <= lVar3) {
    lVar3 = lVar4;
  }
  this->w = (int)lVar3;
  return;
}

Assistant:

PaintBufferFct(BaseWindowData *_p, const ImageAdapterBase &_im, int _x, int _y) :
      p(_p), im(_im), x(_x), y(_y)
    {
      // store image in buffer

      getShiftFromMask(p->image->red_mask, rls, rrs);
      getShiftFromMask(p->image->green_mask, gls, grs);
      getShiftFromMask(p->image->blue_mask, bls, brs);

      w=std::min(static_cast<long>(p->image->width), x+im.getWidth());
    }